

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode rtsp_do(Curl_easy *data,_Bool *done)

{
  undefined1 *puVar1;
  long *plVar2;
  Curl_RtspReq CVar3;
  connectdata *conn;
  FILEPROTO *pFVar4;
  char *pcVar5;
  long size;
  uint uVar6;
  CURLcode CVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  size_t blen;
  char *path;
  char *pcVar14;
  char *local_98;
  char *local_88;
  char *local_80;
  char *local_78;
  dynbuf req_buffer;
  
  conn = data->conn;
  pFVar4 = (data->req).p.file;
  CVar3 = (data->set).rtspreq;
  *done = true;
  Curl_dyn_init(&req_buffer,0x10000);
  pFVar4->path = (char *)(data->state).rtsp_next_client_CSeq;
  pFVar4->freepath = (char *)0x0;
  if ((data->state).first_host == (char *)0x0) {
    pcVar9 = (*Curl_cstrdup)((conn->host).name);
    (data->state).first_host = pcVar9;
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).first_remote_port = conn->remote_port;
    (data->state).first_remote_protocol = conn->handler->protocol;
  }
  uVar6 = *(uint *)&(data->req).field_0xd9;
  *(uint *)&(data->req).field_0xd9 = uVar6 | 0x20000;
  if (0xb < CVar3 - RTSPREQ_OPTIONS) {
    pcVar9 = "Got invalid RTSP request";
LAB_00148340:
    Curl_failf(data,pcVar9);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  uVar6 = uVar6 & 0xfffdffff;
  switch(CVar3) {
  case RTSPREQ_OPTIONS:
    pcVar9 = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    *(uint *)&(data->req).field_0xd9 = uVar6;
    pcVar9 = "DESCRIBE";
    break;
  case RTSPREQ_ANNOUNCE:
    pcVar9 = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    pcVar9 = "SETUP";
    break;
  case RTSPREQ_PLAY:
    pcVar9 = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    pcVar9 = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    pcVar9 = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    *(uint *)&(data->req).field_0xd9 = uVar6;
    pcVar9 = "GET_PARAMETER";
    break;
  case RTSPREQ_SET_PARAMETER:
    pcVar9 = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    pcVar9 = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    *(uint *)&(data->req).field_0xd9 = uVar6;
    Curl_xfer_setup1(data,1,-1,true);
    goto LAB_001480ae;
  case RTSPREQ_LAST:
    pcVar9 = "Got invalid RTSP request: RTSPREQ_LAST";
    goto LAB_00148340;
  }
  pcVar5 = (data->set).str[0x33];
  if (CVar3 < RTSPREQ_GET_PARAMETER || pcVar5 != (char *)0x0) {
    pcVar10 = (data->set).str[0x34];
    path = "*";
    if (pcVar10 != (char *)0x0) {
      path = pcVar10;
    }
    local_78 = Curl_checkheaders(data,"Transport",9);
    if (local_78 != (char *)0x0 || CVar3 != RTSPREQ_SETUP) {
      if (CVar3 == RTSPREQ_DESCRIBE) {
        pcVar10 = Curl_checkheaders(data,"Accept",6);
        pcVar11 = (char *)0x0;
        local_80 = "Accept: application/sdp\r\n";
        if (pcVar10 != (char *)0x0) {
          local_80 = pcVar11;
        }
        pcVar10 = Curl_checkheaders(data,"Accept-Encoding",0xf);
        if (pcVar10 == (char *)0x0) {
          if ((data->set).str[0x21] == (char *)0x0) goto LAB_00148241;
          (*Curl_cfree)((data->state).aptr.accept_encoding);
          (data->state).aptr.accept_encoding = (char *)0x0;
          pcVar11 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[0x21]);
          (data->state).aptr.accept_encoding = pcVar11;
          if (pcVar11 == (char *)0x0) {
            CVar7 = CURLE_OUT_OF_MEMORY;
            goto LAB_001482c1;
          }
        }
      }
      else {
        local_80 = (char *)0x0;
LAB_00148241:
        pcVar11 = (char *)0x0;
      }
      pcVar10 = Curl_checkheaders(data,"User-Agent",10);
      if ((pcVar10 == (char *)0x0) || (pcVar10 = (data->state).aptr.uagent, pcVar10 == (char *)0x0))
      {
        pcVar10 = Curl_checkheaders(data,"User-Agent",10);
        if (pcVar10 != (char *)0x0) goto LAB_0014829a;
        if ((data->set).str[0x2b] == (char *)0x0) {
          local_98 = (char *)0x0;
        }
        else {
          local_98 = (data->state).aptr.uagent;
        }
      }
      else {
        (*Curl_cfree)(pcVar10);
        (data->state).aptr.uagent = (char *)0x0;
LAB_0014829a:
        local_98 = (char *)0x0;
      }
      CVar7 = Curl_http_output_auth(data,conn,pcVar9,HTTPREQ_GET,path,false);
      if (CVar7 != CURLE_OK) goto LAB_001482c1;
      pcVar10 = (data->state).aptr.proxyuserpwd;
      pcVar14 = (data->state).aptr.userpwd;
      (*Curl_cfree)((data->state).aptr.ref);
      (data->state).aptr.ref = (char *)0x0;
      if ((data->state).referer == (char *)0x0) {
        local_88 = (char *)0x0;
      }
      else {
        pcVar12 = Curl_checkheaders(data,"Referer",7);
        if (pcVar12 == (char *)0x0) {
          local_88 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
          (data->state).aptr.ref = local_88;
        }
        else {
          local_88 = (data->state).aptr.ref;
        }
      }
      if (((((data->state).field_0x775 & 1) == 0) ||
          (pcVar12 = Curl_checkheaders(data,"Range",5), pcVar12 != (char *)0x0)) ||
         ((data->state).range == (char *)0x0)) {
        pcVar12 = (char *)0x0;
      }
      else {
        (*Curl_cfree)((data->state).aptr.rangeline);
        (data->state).aptr.rangeline = (char *)0x0;
        pcVar12 = curl_maprintf("Range: %s\r\n",(data->state).range);
        (data->state).aptr.rangeline = pcVar12;
      }
      pcVar13 = Curl_checkheaders(data,"CSeq",4);
      if (pcVar13 != (char *)0x0) {
        Curl_failf(data,"CSeq cannot be set as a custom header.");
        CVar7 = CURLE_RTSP_CSEQ_ERROR;
        goto LAB_001482c1;
      }
      pcVar13 = Curl_checkheaders(data,"Session",7);
      if (pcVar13 != (char *)0x0) {
        pcVar9 = "Session ID cannot be set as a custom header.";
        goto LAB_0014841e;
      }
      CVar7 = Curl_dyn_addf(&req_buffer,"%s %s RTSP/1.0\r\nCSeq: %ld\r\n",pcVar9,path,pFVar4->path);
      if ((CVar7 != CURLE_OK) ||
         ((pcVar5 != (char *)0x0 &&
          (CVar7 = Curl_dyn_addf(&req_buffer,"Session: %s\r\n"), CVar7 != CURLE_OK))))
      goto LAB_001482c1;
      if (local_78 == (char *)0x0) {
        local_78 = "";
      }
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      if (pcVar11 == (char *)0x0) {
        pcVar11 = "";
      }
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      if (local_88 == (char *)0x0) {
        local_88 = "";
      }
      if (local_98 == (char *)0x0) {
        local_98 = "";
      }
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "";
      }
      CVar7 = Curl_dyn_addf(&req_buffer,"%s%s%s%s%s%s%s%s",local_78,local_80,pcVar11,pcVar12,
                            local_88,local_98,pcVar10,pcVar14);
      (*Curl_cfree)((data->state).aptr.userpwd);
      (data->state).aptr.userpwd = (char *)0x0;
      if ((CVar7 != CURLE_OK) ||
         ((((CVar3 == RTSPREQ_SETUP || (CVar3 == RTSPREQ_DESCRIBE)) &&
           (CVar7 = Curl_add_timecondition(data,&req_buffer), CVar7 != CURLE_OK)) ||
          (CVar7 = Curl_add_custom_headers(data,false,&req_buffer), CVar7 != CURLE_OK))))
      goto LAB_001482c1;
      if ((CVar3 < RTSPREQ_RECORD) && ((0x308U >> (CVar3 & 0x1f) & 1) != 0)) {
        if (((data->state).field_0x776 & 2) == 0) {
          pcVar9 = (char *)(data->set).postfields;
          if (pcVar9 == (char *)0x0) {
            blen = (data->state).infilesize;
            if ((long)blen < 0) {
              CVar7 = Curl_creader_set_null(data);
              blen = 0;
            }
            else {
              CVar7 = Curl_creader_set_fread(data,blen);
            }
          }
          else {
            blen = strlen(pcVar9);
            CVar7 = Curl_creader_set_buf(data,pcVar9,blen);
          }
        }
        else {
          blen = (data->state).infilesize;
          (data->state).httpreq = '\x04';
          CVar7 = Curl_creader_set_fread(data,blen);
        }
        if (CVar7 != CURLE_OK) goto LAB_001482c1;
        if ((long)blen < 1) {
          if (CVar3 == RTSPREQ_GET_PARAMETER) {
            (data->state).httpreq = '\x05';
            puVar1 = &(data->req).field_0xdb;
            *puVar1 = *puVar1 | 2;
          }
          goto LAB_001486cf;
        }
        pcVar9 = Curl_checkheaders(data,"Content-Length",0xe);
        if ((pcVar9 == (char *)0x0) &&
           (CVar7 = Curl_dyn_addf(&req_buffer,"Content-Length: %ld\r\n",blen), CVar7 != CURLE_OK))
        goto LAB_001482c1;
        if ((CVar3 & RTSPREQ_RECORD) == RTSPREQ_GET_PARAMETER) {
          pcVar9 = Curl_checkheaders(data,"Content-Type",0xc);
          if (pcVar9 == (char *)0x0) {
            pcVar9 = "Content-Type: text/parameters\r\n";
LAB_00148796:
            CVar7 = Curl_dyn_addn(&req_buffer,pcVar9,0x1f);
            goto LAB_00148616;
          }
        }
        else if ((CVar3 == RTSPREQ_ANNOUNCE) &&
                (pcVar9 = Curl_checkheaders(data,"Content-Type",0xc), pcVar9 == (char *)0x0)) {
          pcVar9 = "Content-Type: application/sdp\r\n";
          goto LAB_00148796;
        }
      }
      else {
        CVar7 = Curl_creader_set_null(data);
LAB_00148616:
        if (CVar7 != CURLE_OK) goto LAB_001482c1;
      }
LAB_001486cf:
      CVar7 = Curl_dyn_addn(&req_buffer,"\r\n",2);
      if (CVar7 == CURLE_OK) {
        Curl_xfer_setup1(data,3,-1,true);
        CVar7 = Curl_req_send(data,&req_buffer);
        if (CVar7 == CURLE_OK) {
          plVar2 = &(data->state).rtsp_next_client_CSeq;
          *plVar2 = *plVar2 + 1;
          size = (data->req).writebytecount;
          if (size == 0) {
LAB_001480ae:
            CVar7 = CURLE_OK;
          }
          else {
            Curl_pgrsSetUploadCounter(data,size);
            iVar8 = Curl_pgrsUpdate(data);
            CVar7 = CURLE_ABORTED_BY_CALLBACK;
            if (iVar8 == 0) {
              CVar7 = CURLE_OK;
            }
          }
        }
        else {
          Curl_failf(data,"Failed sending RTSP request");
        }
      }
      goto LAB_001482c1;
    }
    if ((data->set).str[0x35] != (char *)0x0) {
      (*Curl_cfree)((data->state).aptr.rtsp_transport);
      (data->state).aptr.rtsp_transport = (char *)0x0;
      local_80 = (char *)0x0;
      local_78 = curl_maprintf("Transport: %s\r\n",(data->set).str[0x35]);
      (data->state).aptr.rtsp_transport = local_78;
      if (local_78 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      goto LAB_00148241;
    }
    pcVar9 = "Refusing to issue an RTSP SETUP without a Transport: header.";
LAB_0014841e:
    Curl_failf(data,pcVar9);
  }
  else {
    Curl_failf(data,"Refusing to issue an RTSP request [%s] without a session ID.");
  }
  CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_001482c1:
  Curl_dyn_free(&req_buffer);
  return CVar7;
}

Assistant:

static CURLcode rtsp_do(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_RtspReq rtspreq = data->set.rtspreq;
  struct RTSP *rtsp = data->req.p.rtsp;
  struct dynbuf req_buffer;

  const char *p_request = NULL;
  const char *p_session_id = NULL;
  const char *p_accept = NULL;
  const char *p_accept_encoding = NULL;
  const char *p_range = NULL;
  const char *p_referrer = NULL;
  const char *p_stream_uri = NULL;
  const char *p_transport = NULL;
  const char *p_uagent = NULL;
  const char *p_proxyuserpwd = NULL;
  const char *p_userpwd = NULL;

  *done = TRUE;
  /* Initialize a dynamic send buffer */
  Curl_dyn_init(&req_buffer, DYN_RTSP_REQ_HEADER);

  rtsp->CSeq_sent = data->state.rtsp_next_client_CSeq;
  rtsp->CSeq_recv = 0;

  /* Setup the first_* fields to allow auth details get sent
     to this origin */

  if(!data->state.first_host) {
    data->state.first_host = strdup(conn->host.name);
    if(!data->state.first_host)
      return CURLE_OUT_OF_MEMORY;

    data->state.first_remote_port = conn->remote_port;
    data->state.first_remote_protocol = conn->handler->protocol;
  }

  /* Setup the 'p_request' pointer to the proper p_request string
   * Since all RTSP requests are included here, there is no need to
   * support custom requests like HTTP.
   **/
  data->req.no_body = TRUE; /* most requests do not contain a body */
  switch(rtspreq) {
  default:
    failf(data, "Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  case RTSPREQ_OPTIONS:
    p_request = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_request = "DESCRIBE";
    data->req.no_body = FALSE;
    break;
  case RTSPREQ_ANNOUNCE:
    p_request = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_request = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_request = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_request = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_request = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    /* GET_PARAMETER's no_body status is determined later */
    p_request = "GET_PARAMETER";
    data->req.no_body = FALSE;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_request = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_request = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_request = "";
    /* Treat interleaved RTP as body */
    data->req.no_body = FALSE;
    break;
  case RTSPREQ_LAST:
    failf(data, "Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  if(rtspreq == RTSPREQ_RECEIVE) {
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, TRUE);
    goto out;
  }

  p_session_id = data->set.str[STRING_RTSP_SESSION_ID];
  if(!p_session_id &&
     (rtspreq & ~(Curl_RtspReq)(RTSPREQ_OPTIONS |
                                RTSPREQ_DESCRIBE |
                                RTSPREQ_SETUP))) {
    failf(data, "Refusing to issue an RTSP request [%s] without a session ID.",
          p_request);
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto out;
  }

  /* Stream URI. Default to server '*' if not specified */
  if(data->set.str[STRING_RTSP_STREAM_URI]) {
    p_stream_uri = data->set.str[STRING_RTSP_STREAM_URI];
  }
  else {
    p_stream_uri = "*";
  }

  /* Transport Header for SETUP requests */
  p_transport = Curl_checkheaders(data, STRCONST("Transport"));
  if(rtspreq == RTSPREQ_SETUP && !p_transport) {
    /* New Transport: setting? */
    if(data->set.str[STRING_RTSP_TRANSPORT]) {
      Curl_safefree(data->state.aptr.rtsp_transport);

      data->state.aptr.rtsp_transport =
        aprintf("Transport: %s\r\n",
                data->set.str[STRING_RTSP_TRANSPORT]);
      if(!data->state.aptr.rtsp_transport)
        return CURLE_OUT_OF_MEMORY;
    }
    else {
      failf(data,
            "Refusing to issue an RTSP SETUP without a Transport: header.");
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto out;
    }

    p_transport = data->state.aptr.rtsp_transport;
  }

  /* Accept Headers for DESCRIBE requests */
  if(rtspreq == RTSPREQ_DESCRIBE) {
    /* Accept Header */
    p_accept = Curl_checkheaders(data, STRCONST("Accept")) ?
      NULL : "Accept: application/sdp\r\n";

    /* Accept-Encoding header */
    if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
       data->set.str[STRING_ENCODING]) {
      Curl_safefree(data->state.aptr.accept_encoding);
      data->state.aptr.accept_encoding =
        aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);

      if(!data->state.aptr.accept_encoding) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      p_accept_encoding = data->state.aptr.accept_encoding;
    }
  }

  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(data, STRCONST("User-Agent")) &&
     data->state.aptr.uagent) {
    Curl_safefree(data->state.aptr.uagent);
  }
  else if(!Curl_checkheaders(data, STRCONST("User-Agent")) &&
          data->set.str[STRING_USERAGENT]) {
    p_uagent = data->state.aptr.uagent;
  }

  /* setup the authentication headers */
  result = Curl_http_output_auth(data, conn, p_request, HTTPREQ_GET,
                                 p_stream_uri, FALSE);
  if(result)
    goto out;

#ifndef CURL_DISABLE_PROXY
  p_proxyuserpwd = data->state.aptr.proxyuserpwd;
#endif
  p_userpwd = data->state.aptr.userpwd;

  /* Referrer */
  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer")))
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);

  p_referrer = data->state.aptr.ref;

  /*
   * Range Header
   * Only applies to PLAY, PAUSE, RECORD
   *
   * Go ahead and use the Range stuff supplied for HTTP
   */
  if(data->state.use_range &&
     (rtspreq  & (RTSPREQ_PLAY | RTSPREQ_PAUSE | RTSPREQ_RECORD))) {

    /* Check to see if there is a range set in the custom headers */
    if(!Curl_checkheaders(data, STRCONST("Range")) && data->state.range) {
      Curl_safefree(data->state.aptr.rangeline);
      data->state.aptr.rangeline = aprintf("Range: %s\r\n", data->state.range);
      p_range = data->state.aptr.rangeline;
    }
  }

  /*
   * Sanity check the custom headers
   */
  if(Curl_checkheaders(data, STRCONST("CSeq"))) {
    failf(data, "CSeq cannot be set as a custom header.");
    result = CURLE_RTSP_CSEQ_ERROR;
    goto out;
  }
  if(Curl_checkheaders(data, STRCONST("Session"))) {
    failf(data, "Session ID cannot be set as a custom header.");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto out;
  }

  result =
    Curl_dyn_addf(&req_buffer,
                  "%s %s RTSP/1.0\r\n" /* Request Stream-URI RTSP/1.0 */
                  "CSeq: %ld\r\n", /* CSeq */
                  p_request, p_stream_uri, rtsp->CSeq_sent);
  if(result)
    goto out;

  /*
   * Rather than do a normal alloc line, keep the session_id unformatted
   * to make comparison easier
   */
  if(p_session_id) {
    result = Curl_dyn_addf(&req_buffer, "Session: %s\r\n", p_session_id);
    if(result)
      goto out;
  }

  /*
   * Shared HTTP-like options
   */
  result = Curl_dyn_addf(&req_buffer,
                         "%s" /* transport */
                         "%s" /* accept */
                         "%s" /* accept-encoding */
                         "%s" /* range */
                         "%s" /* referrer */
                         "%s" /* user-agent */
                         "%s" /* proxyuserpwd */
                         "%s" /* userpwd */
                         ,
                         p_transport ? p_transport : "",
                         p_accept ? p_accept : "",
                         p_accept_encoding ? p_accept_encoding : "",
                         p_range ? p_range : "",
                         p_referrer ? p_referrer : "",
                         p_uagent ? p_uagent : "",
                         p_proxyuserpwd ? p_proxyuserpwd : "",
                         p_userpwd ? p_userpwd : "");

  /*
   * Free userpwd now --- cannot reuse this for Negotiate and possibly NTLM
   * with basic and digest, it will be freed anyway by the next request
   */
  Curl_safefree(data->state.aptr.userpwd);

  if(result)
    goto out;

  if((rtspreq == RTSPREQ_SETUP) || (rtspreq == RTSPREQ_DESCRIBE)) {
    result = Curl_add_timecondition(data, &req_buffer);
    if(result)
      goto out;
  }

  result = Curl_add_custom_headers(data, FALSE, &req_buffer);
  if(result)
    goto out;

  if(rtspreq == RTSPREQ_ANNOUNCE ||
     rtspreq == RTSPREQ_SET_PARAMETER ||
     rtspreq == RTSPREQ_GET_PARAMETER) {
    curl_off_t req_clen; /* request content length */

    if(data->state.upload) {
      req_clen = data->state.infilesize;
      data->state.httpreq = HTTPREQ_PUT;
      result = Curl_creader_set_fread(data, req_clen);
      if(result)
        goto out;
    }
    else {
      if(data->set.postfields) {
        size_t plen = strlen(data->set.postfields);
        req_clen = (curl_off_t)plen;
        result = Curl_creader_set_buf(data, data->set.postfields, plen);
      }
      else if(data->state.infilesize >= 0) {
        req_clen = data->state.infilesize;
        result = Curl_creader_set_fread(data, req_clen);
      }
      else {
        req_clen = 0;
        result = Curl_creader_set_null(data);
      }
      if(result)
        goto out;
    }

    if(req_clen > 0) {
      /* As stated in the http comments, it is probably not wise to
       * actually set a custom Content-Length in the headers */
      if(!Curl_checkheaders(data, STRCONST("Content-Length"))) {
        result =
          Curl_dyn_addf(&req_buffer, "Content-Length: %" FMT_OFF_T"\r\n",
                        req_clen);
        if(result)
          goto out;
      }

      if(rtspreq == RTSPREQ_SET_PARAMETER ||
         rtspreq == RTSPREQ_GET_PARAMETER) {
        if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
          result = Curl_dyn_addn(&req_buffer,
                                 STRCONST("Content-Type: "
                                          "text/parameters\r\n"));
          if(result)
            goto out;
        }
      }

      if(rtspreq == RTSPREQ_ANNOUNCE) {
        if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
          result = Curl_dyn_addn(&req_buffer,
                                 STRCONST("Content-Type: "
                                          "application/sdp\r\n"));
          if(result)
            goto out;
        }
      }
    }
    else if(rtspreq == RTSPREQ_GET_PARAMETER) {
      /* Check for an empty GET_PARAMETER (heartbeat) request */
      data->state.httpreq = HTTPREQ_HEAD;
      data->req.no_body = TRUE;
    }
  }
  else {
    result = Curl_creader_set_null(data);
    if(result)
      goto out;
  }

  /* Finish the request buffer */
  result = Curl_dyn_addn(&req_buffer, STRCONST("\r\n"));
  if(result)
    goto out;

  Curl_xfer_setup1(data, CURL_XFER_SENDRECV, -1, TRUE);

  /* issue the request */
  result = Curl_req_send(data, &req_buffer);
  if(result) {
    failf(data, "Failed sending RTSP request");
    goto out;
  }

  /* Increment the CSeq on success */
  data->state.rtsp_next_client_CSeq++;

  if(data->req.writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is
       noted properly */
    Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
  }
out:
  Curl_dyn_free(&req_buffer);
  return result;
}